

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsapp.cc
# Opt level: O1

int __thiscall
FrobTadsApplication::runTads
          (FrobTadsApplication *this,char *filename,int vm,int argc,char **argv,char *savedState,
          TadsNetConfig *netconfig)

{
  ulong __n;
  int iVar1;
  size_t pathbuflen;
  char *__dest;
  char *pathbuf;
  char *filename_00;
  
  pathbuflen = strlen(filename);
  __n = pathbuflen + 1;
  __dest = (char *)operator_new__(__n);
  memset(__dest,0,__n);
  strcpy(__dest,filename);
  filename_00 = __dest;
  if ((this->options).changeDir == true) {
    pathbuf = (char *)operator_new__(__n);
    memset(pathbuf,0,__n);
    *pathbuf = '\0';
    os_get_path_name(pathbuf,pathbuflen,filename);
    iVar1 = chdir(pathbuf);
    if (iVar1 == 0) {
      filename_00 = os_get_root_name(__dest);
    }
    operator_delete__(pathbuf);
  }
  (**this->_vptr_FrobTadsApplication)(this);
  G_oss_screen_width = (*this->_vptr_FrobTadsApplication[0xb])(this);
  G_oss_screen_height = (*this->_vptr_FrobTadsApplication[10])(this);
  osssbini((this->options).scrollBufSize);
  iVar1 = ossgetcolor(4,5,0,0);
  ossdsp(0,0,iVar1," ");
  (*globalApp->_vptr_FrobTadsApplication[4])();
  iVar1 = ossgetcolor(2,3,0,0);
  ossdsp(0,0,iVar1," ");
  (*globalApp->_vptr_FrobTadsApplication[4])();
  if (vm == 0) {
    iVar1 = fRunTads2(this,filename_00);
  }
  else {
    iVar1 = fRunTads3(this,filename_00,argc,argv,savedState,netconfig);
  }
  os_expause();
  osssbdel();
  operator_delete__(__dest);
  return iVar1;
}

Assistant:

int
FrobTadsApplication::runTads( const char* filename, int vm, int argc, const char *const *argv,
                              const char* savedState, class TadsNetConfig* netconfig )
{
    // We might strip the path from the filename later, in case we
    // change the current directory.
    size_t filenameLen = strlen(filename);
    char* finalFilenamePtr;
    const auto finalFilename = std::make_unique<char[]>(filenameLen + 1);
    strcpy(finalFilename.get(), filename);
    finalFilenamePtr = finalFilename.get();

    // We'll try setting the current directory to the game's
    // directory (if the user didn't tell us not to).
    if (this->options.changeDir) {
        const auto gameDirBuf = std::make_unique<char[]>(filenameLen + 1);
        gameDirBuf[0] = '\0'; // Paranoia.
        os_get_path_name(gameDirBuf.get(), filenameLen, filename);
        // Try changing the current directory.
        if (this->changeDirectory(gameDirBuf.get())) {
            // Success.  Since we changed the current
            // directory, we must adapt the filename by
            // stripping it from its path.  For this
            // purpose, we'll just store the position of the
            // filename's first character.
            finalFilenamePtr = os_get_root_name(finalFilename.get());
        }
    }

    // Initialize the screen.
    this->init();

    // The osgen layer uses these global variables to determine the
    // size of the screen; set them to the width and height of our
    // game window.
    G_oss_screen_width = this->width();
    G_oss_screen_height = this->height();

    // Initialize the osgen scrollback buffer.
    osssbini(this->options.scrollBufSize);

    // A kludge to circumvent a curses color problem; display one
    // character in reverse video then one in normal colors.  This
    // avoids the problem where the first block of text is shown in
    // wrong colors.
    int tmpColor = ossgetcolor(OSGEN_COLOR_STATUSLINE, OSGEN_COLOR_STATUSBG, 0, 0);
    ossdsp(0, 0, tmpColor, " ");
    globalApp->flush();
    tmpColor = ossgetcolor(OSGEN_COLOR_TEXT, OSGEN_COLOR_TEXTBG, 0, 0);
    ossdsp(0, 0, tmpColor, " ");
    globalApp->flush();

    // Run the VM.
    int vmRet = vm == 0 ? this->fRunTads2(finalFilenamePtr)
                        : this->fRunTads3(finalFilenamePtr, argc, argv, savedState, netconfig);

    // Pause.
    os_expause();

    // Delete the scrollback buffer.
    osssbdel();

    // Return the VM's exit code.
    return vmRet;
}